

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

DOMDocumentFragment * __thiscall
xercesc_4_0::DOMRangeImpl::traverseCommonEndContainer
          (DOMRangeImpl *this,DOMNode *startAncestor,int how)

{
  XMLSize_t XVar1;
  int iVar2;
  DOMRangeImpl *pDVar3;
  DOMNode *pDVar4;
  XMLSize_t XVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMRangeImpl *pDVar6;
  DOMRangeImpl *this_00;
  int iVar7;
  undefined4 extraout_var;
  
  if (how == 3) {
    pDVar3 = (DOMRangeImpl *)0x0;
  }
  else {
    iVar2 = (*(this->fDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
    pDVar3 = (DOMRangeImpl *)CONCAT44(extraout_var,iVar2);
  }
  pDVar6 = this;
  pDVar4 = traverseLeftBoundary(this,startAncestor,how);
  if (pDVar3 != (DOMRangeImpl *)0x0) {
    pDVar6 = pDVar3;
    (*((DOMNode *)&pDVar3->super_DOMRange)->_vptr_DOMNode[0x11])(pDVar3,pDVar4);
  }
  XVar5 = indexOf(pDVar6,startAncestor,this->fEndContainer);
  XVar1 = this->fEndOffset;
  iVar2 = (*startAncestor->_vptr_DOMNode[10])(startAncestor);
  pDVar6 = (DOMRangeImpl *)CONCAT44(extraout_var_00,iVar2);
  for (iVar7 = ~(uint)XVar5 + (int)XVar1; 0 < iVar7; iVar7 = iVar7 + -1) {
    this_00 = pDVar6;
    iVar2 = (*(pDVar6->super_DOMRange)._vptr_DOMRange[10])();
    pDVar4 = traverseFullySelected(this_00,(DOMNode *)pDVar6,how);
    if (pDVar3 != (DOMRangeImpl *)0x0) {
      (*((DOMNode *)&pDVar3->super_DOMRange)->_vptr_DOMNode[0x11])(pDVar3,pDVar4);
    }
    pDVar6 = (DOMRangeImpl *)CONCAT44(extraout_var_01,iVar2);
  }
  if (how != 2) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xb])(this,startAncestor);
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
  }
  return (DOMDocumentFragment *)pDVar3;
}

Assistant:

DOMDocumentFragment* DOMRangeImpl::traverseCommonEndContainer( DOMNode*startAncestor, int how )
{
    DOMDocumentFragment* frag = 0;
    if ( how!=DELETE_CONTENTS)
        frag = fDocument->createDocumentFragment();
    DOMNode* n = traverseLeftBoundary( startAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );
    XMLSize_t startIdx = indexOf( startAncestor, fEndContainer );
    ++startIdx;  // Because we already traversed it....

    int cnt = (int)fEndOffset - (int)startIdx;
    n = startAncestor->getNextSibling();
    while( cnt > 0 )
    {
        DOMNode* sibling = n->getNextSibling();
        DOMNode* xferNode = traverseFullySelected( n, how );
        if ( frag!=0 )
            frag->appendChild( xferNode );
        --cnt;
        n = sibling;
    }

    if ( how != CLONE_CONTENTS )
    {
        setStartAfter( startAncestor );
        collapse( true );
    }

    return frag;
}